

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::processingNumber(CScanner *this,char c)

{
  CToken *token;
  bool bVar1;
  TDigit TVar2;
  TDigitIndex TVar3;
  allocator local_59;
  CArbitraryInteger number;
  string local_38;
  
  if ((byte)(c - 0x30U) < 10) {
    std::__cxx11::string::push_back((char)this + -0x50);
    return;
  }
  if (c != '/') {
    error(this,E_UnclosedNumber,c);
    this->state = S_Initial;
    processing(this,c);
    return;
  }
  CArbitraryInteger::CArbitraryInteger(&number);
  bVar1 = CArbitraryInteger::SetValueByText
                    (&number,&(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                              super_CQualifierParser.token.word);
  if (!bVar1) {
    __assert_fail("isNumber",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x270,"void Refal2::CScanner::processingNumber(char)");
  }
  bVar1 = CArbitraryInteger::IsZero(&number);
  if ((!bVar1) && (number.isNegative == true)) {
    __assert_fail("number.IsZero() || !number.IsNegative()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x271,"void Refal2::CScanner::processingNumber(char)");
  }
  token = &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.
           token;
  token->type = TT_Number;
  bVar1 = CArbitraryInteger::IsZero(&number);
  TVar2 = 0;
  if (!bVar1) {
    TVar2 = CArbitraryInteger::GetDigit(&number,0);
  }
  (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.number
       = TVar2;
  TVar3 = CArbitraryInteger::GetSize(&number);
  if (1 < TVar3) {
    std::__cxx11::string::string
              ((string *)&local_38,"a constant value is too large for the number (max 2^24 - 1)",
               &local_59);
    CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_38,token);
    std::__cxx11::string::~string((string *)&local_38);
  }
  (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type =
       TT_Number;
  CParser::AddToken(&this->super_CParser);
  this->state = S_Initial;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&number);
  return;
}

Assistant:

void CScanner::processingNumber( char c )
{
	if( IsDigit( c ) ) {
		token.word += c;
	} else if( c == LimiterOfSymbol ) {
		CArbitraryInteger number;
		const bool isNumber = number.SetValueByText( token.word );
		assert( isNumber );
		assert( number.IsZero() || !number.IsNegative() );
		token.type = TT_Number;
		token.number = number.IsZero() ? 0 : number.GetDigit( 0 );
		if( number.GetSize() > 1 ) {
			CErrorsHelper::RaiseError( ES_Error,
				"a constant value is too large for the number (max 2^24 - 1)",
				token );
		}
		addToken( TT_Number );
		state = S_Initial;
	} else {
		error( E_UnclosedNumber, c );
		state = S_Initial;
		processing( c );
	}
}